

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

int encodeutf8(uchar *dstbuf,int dstlen,uchar *srcbuf,int srclen,int *carry)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar *puVar5;
  uchar *a;
  uchar *puVar6;
  uchar *puVar7;
  byte *pbVar8;
  uchar *end;
  int uni;
  uchar *srcend;
  uchar *src;
  uchar *dstend;
  uchar *dst;
  int *carry_local;
  int srclen_local;
  uchar *srcbuf_local;
  int dstlen_local;
  uchar *dstbuf_local;
  
  puVar5 = dstbuf + dstlen;
  a = srcbuf + srclen;
  srcend = srcbuf;
  dstend = dstbuf;
  if ((srcbuf < a) && (dstend = dstbuf, dstbuf < puVar5)) {
    do {
      end._4_4_ = cube2uni(*srcend);
      if (end._4_4_ < 0x80) {
        if (puVar5 <= dstend) break;
        puVar6 = min<unsigned_char_const*>(a,srcend + ((long)puVar5 - (long)dstend));
        do {
          puVar7 = dstend + 1;
          *dstend = (uchar)end._4_4_;
          srcend = srcend + 1;
          dstend = puVar7;
          if (puVar6 <= srcend) goto LAB_00191145;
          end._4_4_ = cube2uni(*srcend);
        } while (end._4_4_ < 0x80);
      }
      bVar1 = (byte)(end._4_4_ >> 6);
      if (end._4_4_ < 0x800) {
        if (puVar5 < dstend + 2) break;
        *dstend = bVar1 | 0xc0;
        puVar7 = dstend;
      }
      else {
        bVar2 = (byte)(end._4_4_ >> 0xc);
        if (end._4_4_ < 0x10000) {
          if (puVar5 < dstend + 3) break;
          *dstend = bVar2 | 0xe0;
          dstend = dstend + 1;
        }
        else {
          bVar3 = (byte)(end._4_4_ >> 0x12);
          if (end._4_4_ < 0x200000) {
            if (puVar5 < dstend + 4) break;
            *dstend = bVar3 | 0xf0;
            puVar7 = dstend;
          }
          else {
            bVar4 = (byte)((uint)end._4_4_ >> 0x18);
            if (end._4_4_ < 0x4000000) {
              if (puVar5 < dstend + 5) break;
              *dstend = bVar4 | 0xf8;
              dstend = dstend + 1;
            }
            else {
              if (puVar5 < dstend + 6) break;
              pbVar8 = dstend + 1;
              *dstend = (char)bVar4 >> 6 | 0xfc;
              dstend = dstend + 2;
              *pbVar8 = bVar4 & 0x3f | 0x80;
            }
            *dstend = bVar3 & 0x3f | 0x80;
            puVar7 = dstend;
          }
          dstend = puVar7 + 1;
          *dstend = bVar2 & 0x3f | 0x80;
          dstend = puVar7 + 2;
        }
        *dstend = bVar1 & 0x3f | 0x80;
        puVar7 = dstend;
      }
      dstend = puVar7 + 1;
      *dstend = (byte)end._4_4_ & 0x3f | 0x80;
      srcend = srcend + 1;
      dstend = puVar7 + 2;
    } while (srcend < a);
  }
LAB_00191145:
  if (carry != (int *)0x0) {
    *carry = *carry + ((int)srcend - (int)srcbuf);
  }
  return (int)dstend - (int)dstbuf;
}

Assistant:

int encodeutf8(uchar *dstbuf, int dstlen, const uchar *srcbuf, int srclen, int *carry)
{
    uchar *dst = dstbuf, *dstend = &dstbuf[dstlen];
    const uchar *src = srcbuf, *srcend = &srcbuf[srclen];
    if(src < srcend && dst < dstend) do
    {
        int uni = cube2uni(*src);
        if(uni <= 0x7F)
        {
            if(dst >= dstend) goto done;
            const uchar *end = min(srcend, &src[dstend-dst]);
            do
            {
                *dst++ = uni;
                if(++src >= end) goto done;
                uni = cube2uni(*src);
            }
            while(uni <= 0x7F);
        }
        if(uni <= 0x7FF) { if(dst + 2 > dstend) goto done; *dst++ = 0xC0 | (uni>>6); goto uni2; }
        else if(uni <= 0xFFFF) { if(dst + 3 > dstend) goto done; *dst++ = 0xE0 | (uni>>12); goto uni3; }
        else if(uni <= 0x1FFFFF) { if(dst + 4 > dstend) goto done; *dst++ = 0xF0 | (uni>>18); goto uni4; }
        else if(uni <= 0x3FFFFFF) { if(dst + 5 > dstend) goto done; *dst++ = 0xF8 | (uni>>24); goto uni5; }
        else if(uni <= 0x7FFFFFFF) { if(dst + 6 > dstend) goto done; *dst++ = 0xFC | (uni>>30); goto uni6; }
        else goto uni1;
    uni6: *dst++ = 0x80 | ((uni>>24)&0x3F);
    uni5: *dst++ = 0x80 | ((uni>>18)&0x3F);
    uni4: *dst++ = 0x80 | ((uni>>12)&0x3F);
    uni3: *dst++ = 0x80 | ((uni>>6)&0x3F);
    uni2: *dst++ = 0x80 | (uni&0x3F);
    uni1:;
    }
    while(++src < srcend);

done:
    if(carry) *carry += src - srcbuf;
    return dst - dstbuf;
}